

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

void aom_noise_model_free(aom_noise_model_t *model)

{
  aom_equation_system_t *eqns;
  long lVar1;
  
  if (model != (aom_noise_model_t *)0x0) {
    aom_free(model->coords);
    eqns = &model->latest_state[0].strength_solver.eqns;
    lVar1 = 3;
    do {
      equation_system_free(eqns + -1);
      equation_system_free((aom_equation_system_t *)&eqns[-0xc].x);
      equation_system_free(eqns);
      equation_system_free((aom_equation_system_t *)&eqns[-0xb].x);
      eqns = (aom_equation_system_t *)&eqns[3].x;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    memset(model,0,0x2c0);
    return;
  }
  return;
}

Assistant:

void aom_noise_model_free(aom_noise_model_t *model) {
  int c = 0;
  if (!model) return;

  aom_free(model->coords);
  for (c = 0; c < 3; ++c) {
    equation_system_free(&model->latest_state[c].eqns);
    equation_system_free(&model->combined_state[c].eqns);

    equation_system_free(&model->latest_state[c].strength_solver.eqns);
    equation_system_free(&model->combined_state[c].strength_solver.eqns);
  }
  memset(model, 0, sizeof(*model));
}